

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_Parser.h
# Opt level: O3

void __thiscall soul::StructuralParser::parseProcessorLatencyDeclaration(StructuralParser *this)

{
  ModuleBase *pMVar1;
  ProcessorProperty *pPVar2;
  Expression *pEVar3;
  long lVar4;
  CompileMessage local_c0;
  CompileMessage local_88;
  CompileMessage local_50;
  
  pPVar2 = parseProcessorProperty(this);
  if (*(int *)&(pPVar2->super_Expression).field_0x2c != 5) {
    CompileMessageHelpers::createMessage<>
              (&local_50,syntax,error,"Expected a function or variable declaration");
    AST::Context::throwError
              (&(pPVar2->super_Expression).super_Statement.super_ASTObject.context,&local_50,false);
  }
  Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
  ::expect<soul::TokenType>(&this->super_SOULTokeniser,(TokenType)0x259fb3);
  pEVar3 = parseExpression(this,false);
  Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
  ::expect<soul::TokenType>(&this->super_SOULTokeniser,(TokenType)0x2585e7);
  pMVar1 = (this->module).object;
  if (pMVar1 != (ModuleBase *)0x0) {
    lVar4 = __dynamic_cast(pMVar1,&AST::ModuleBase::typeinfo,&AST::Processor::typeinfo,0);
    if (lVar4 != 0) {
      if (*(long *)(lVar4 + 0x130) == 0) {
        *(Expression **)(lVar4 + 0x130) = pEVar3;
        return;
      }
      CompileMessageHelpers::createMessage<>
                (&local_88,syntax,error,"The processor.latency value must not be set more than once"
                );
      AST::Context::throwError
                (&(pPVar2->super_Expression).super_Statement.super_ASTObject.context,&local_88,false
                );
    }
  }
  CompileMessageHelpers::createMessage<>
            (&local_c0,syntax,error,
             "The processor.latency value can only be declared in a processor");
  AST::Context::throwError
            (&(pPVar2->super_Expression).super_Statement.super_ASTObject.context,&local_c0,false);
}

Assistant:

void parseProcessorLatencyDeclaration()
    {
        auto& pp = parseProcessorProperty();

        if (pp.property != heart::ProcessorProperty::Property::latency)
            pp.context.throwError (Errors::expectedFunctionOrVariable());

        expect (Operator::assign);
        auto& value = parseExpression();
        expect (Operator::semicolon);

        if (auto p = cast<AST::Processor> (module))
        {
            if (p->latency != nullptr)
                pp.context.throwError (Errors::latencyAlreadyDeclared());

            p->latency = value;
            return;
        }

        pp.context.throwError (Errors::latencyOnlyForProcessor());
    }